

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Interpreter interpreter;
  ptr<ObjectExpression> moduleExpression;
  ptr<Object> module;
  Parser parser;
  __shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b0 [32];
  __shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2> local_90;
  Parser local_80;
  
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage: katon <filepath>");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    Parser::Parser(&local_80,argv[1]);
    Parser::parse((Parser *)local_b0);
    (*(code *)**(undefined8 **)local_b0._0_8_)(&local_c0,local_b0._0_8_,0);
    (*((local_c0._M_ptr)->super_Value).super_Member._vptr_Member[6])(local_b0 + 0x10);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,(__shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 0x10));
    std::__shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_c0,&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    Interpreter::execute((Interpreter *)&local_c0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    Parser::~Parser(&local_80);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc < 2) {
        std::cout << "Usage: katon <filepath>" << std::endl;
        return 0;
    }

    char* filename = argv[1];

    try {
        Parser parser(filename);
        ptr<ObjectExpression> moduleExpression = parser.parse();
        ptr<Object> module = moduleExpression -> evaluate(nullptr) -> asObject();

        Interpreter interpreter(module);
        interpreter.execute();

    } catch(ParseException& e) {
        std::cout << e.what() << std::endl;
    } catch(ThrowPacket& packet) {
        std::cout << "Error: " << packet.getValue() -> asString() << std::endl;
    }

    return 0;
}